

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimInfo.cpp
# Opt level: O0

void __thiscall OpenMD::SimInfo::setSnapshotManager(SimInfo *this,SnapshotManager *sman)

{
  long in_RSI;
  long in_RDI;
  Inversion *inversion;
  Torsion *torsion;
  Bend *bend;
  Bond *bond;
  CutoffGroup *cg;
  RigidBody *rb;
  Atom *atom;
  Molecule *mol;
  InversionIterator inversionIter;
  TorsionIterator torsionIter;
  BendIterator bendIter;
  BondIterator bondIter;
  CutoffGroupIterator cgIter;
  RigidBodyIterator rbIter;
  AtomIterator ai;
  MoleculeIterator mi;
  Inversion *local_90;
  Torsion *in_stack_ffffffffffffff78;
  SimInfo *in_stack_ffffffffffffff80;
  Bond *local_78;
  CutoffGroup *local_70;
  RigidBody *local_68;
  Atom *local_60;
  Molecule *local_58;
  __normal_iterator<OpenMD::Inversion_**,_std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>_>
  local_50;
  __normal_iterator<OpenMD::Torsion_**,_std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>_>
  local_48;
  __normal_iterator<OpenMD::Bend_**,_std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>_>
  local_40;
  __normal_iterator<OpenMD::Bond_**,_std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>_>
  local_38;
  __normal_iterator<OpenMD::CutoffGroup_**,_std::vector<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>_>
  local_30;
  __normal_iterator<OpenMD::RigidBody_**,_std::vector<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>_>
  local_28;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_20;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_18;
  long local_10;
  
  if (*(long *)(in_RDI + 0x2f8) != in_RSI) {
    local_10 = in_RSI;
    if (*(long **)(in_RDI + 0x2f8) != (long *)0x0) {
      (**(code **)(**(long **)(in_RDI + 0x2f8) + 8))();
    }
    *(long *)(in_RDI + 0x2f8) = local_10;
    std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(&local_18);
    __gnu_cxx::
    __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
    ::__normal_iterator(&local_20);
    __gnu_cxx::
    __normal_iterator<OpenMD::RigidBody_**,_std::vector<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>_>
    ::__normal_iterator(&local_28);
    __gnu_cxx::
    __normal_iterator<OpenMD::CutoffGroup_**,_std::vector<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>_>
    ::__normal_iterator(&local_30);
    __gnu_cxx::
    __normal_iterator<OpenMD::Bond_**,_std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>_>
    ::__normal_iterator(&local_38);
    __gnu_cxx::
    __normal_iterator<OpenMD::Bend_**,_std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>_>
    ::__normal_iterator(&local_40);
    __gnu_cxx::
    __normal_iterator<OpenMD::Torsion_**,_std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>_>
    ::__normal_iterator(&local_48);
    __gnu_cxx::
    __normal_iterator<OpenMD::Inversion_**,_std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>_>
    ::__normal_iterator(&local_50);
    local_58 = beginMolecule(in_stack_ffffffffffffff80,(MoleculeIterator *)in_stack_ffffffffffffff78
                            );
    while (local_58 != (Molecule *)0x0) {
      local_60 = Molecule::beginAtom((Molecule *)in_stack_ffffffffffffff80,
                                     (iterator *)in_stack_ffffffffffffff78);
      while (local_60 != (Atom *)0x0) {
        StuntDouble::setSnapshotManager
                  (&local_60->super_StuntDouble,*(SnapshotManager **)(in_RDI + 0x2f8));
        local_60 = Molecule::nextAtom((Molecule *)in_stack_ffffffffffffff80,
                                      (iterator *)in_stack_ffffffffffffff78);
      }
      local_68 = Molecule::beginRigidBody
                           ((Molecule *)in_stack_ffffffffffffff80,
                            (iterator *)in_stack_ffffffffffffff78);
      while (local_68 != (RigidBody *)0x0) {
        StuntDouble::setSnapshotManager
                  (&local_68->super_StuntDouble,*(SnapshotManager **)(in_RDI + 0x2f8));
        local_68 = Molecule::nextRigidBody
                             ((Molecule *)in_stack_ffffffffffffff80,
                              (iterator *)in_stack_ffffffffffffff78);
      }
      local_70 = Molecule::beginCutoffGroup
                           ((Molecule *)in_stack_ffffffffffffff80,
                            (iterator *)in_stack_ffffffffffffff78);
      while (local_70 != (CutoffGroup *)0x0) {
        CutoffGroup::setSnapshotManager(local_70,*(SnapshotManager **)(in_RDI + 0x2f8));
        local_70 = Molecule::nextCutoffGroup
                             ((Molecule *)in_stack_ffffffffffffff80,
                              (iterator *)in_stack_ffffffffffffff78);
      }
      local_78 = Molecule::beginBond((Molecule *)in_stack_ffffffffffffff80,
                                     (iterator *)in_stack_ffffffffffffff78);
      while (local_78 != (Bond *)0x0) {
        ShortRangeInteraction::setSnapshotManager
                  (&local_78->super_ShortRangeInteraction,*(SnapshotManager **)(in_RDI + 0x2f8));
        local_78 = Molecule::nextBond((Molecule *)in_stack_ffffffffffffff80,
                                      (iterator *)in_stack_ffffffffffffff78);
      }
      for (in_stack_ffffffffffffff80 =
                (SimInfo *)
                Molecule::beginBend((Molecule *)in_stack_ffffffffffffff80,
                                    (iterator *)in_stack_ffffffffffffff78);
          in_stack_ffffffffffffff80 != (SimInfo *)0x0;
          in_stack_ffffffffffffff80 =
               (SimInfo *)
               Molecule::nextBend((Molecule *)in_stack_ffffffffffffff80,
                                  (iterator *)in_stack_ffffffffffffff78)) {
        ShortRangeInteraction::setSnapshotManager
                  ((ShortRangeInteraction *)in_stack_ffffffffffffff80,
                   *(SnapshotManager **)(in_RDI + 0x2f8));
      }
      for (in_stack_ffffffffffffff78 =
                Molecule::beginTorsion((Molecule *)0x0,(iterator *)in_stack_ffffffffffffff78);
          in_stack_ffffffffffffff78 != (Torsion *)0x0;
          in_stack_ffffffffffffff78 =
               Molecule::nextTorsion
                         ((Molecule *)in_stack_ffffffffffffff80,
                          (iterator *)in_stack_ffffffffffffff78)) {
        ShortRangeInteraction::setSnapshotManager
                  (&in_stack_ffffffffffffff78->super_ShortRangeInteraction,
                   *(SnapshotManager **)(in_RDI + 0x2f8));
      }
      local_90 = Molecule::beginInversion((Molecule *)in_stack_ffffffffffffff80,(iterator *)0x0);
      while (local_90 != (Inversion *)0x0) {
        ShortRangeInteraction::setSnapshotManager
                  (&local_90->super_ShortRangeInteraction,*(SnapshotManager **)(in_RDI + 0x2f8));
        local_90 = Molecule::nextInversion
                             ((Molecule *)in_stack_ffffffffffffff80,
                              (iterator *)in_stack_ffffffffffffff78);
      }
      local_58 = nextMolecule(in_stack_ffffffffffffff80,
                              (MoleculeIterator *)in_stack_ffffffffffffff78);
    }
  }
  return;
}

Assistant:

void SimInfo::setSnapshotManager(SnapshotManager* sman) {
    if (sman_ == sman) { return; }
    delete sman_;
    sman_ = sman;

    SimInfo::MoleculeIterator mi;
    Molecule::AtomIterator ai;
    Molecule::RigidBodyIterator rbIter;
    Molecule::CutoffGroupIterator cgIter;
    Molecule::BondIterator bondIter;
    Molecule::BendIterator bendIter;
    Molecule::TorsionIterator torsionIter;
    Molecule::InversionIterator inversionIter;

    Molecule* mol;
    Atom* atom;
    RigidBody* rb;
    CutoffGroup* cg;
    Bond* bond;
    Bend* bend;
    Torsion* torsion;
    Inversion* inversion;

    for (mol = beginMolecule(mi); mol != NULL; mol = nextMolecule(mi)) {
      for (atom = mol->beginAtom(ai); atom != NULL; atom = mol->nextAtom(ai)) {
        atom->setSnapshotManager(sman_);
      }
      for (rb = mol->beginRigidBody(rbIter); rb != NULL;
           rb = mol->nextRigidBody(rbIter)) {
        rb->setSnapshotManager(sman_);
      }
      for (cg = mol->beginCutoffGroup(cgIter); cg != NULL;
           cg = mol->nextCutoffGroup(cgIter)) {
        cg->setSnapshotManager(sman_);
      }
      for (bond = mol->beginBond(bondIter); bond != NULL;
           bond = mol->nextBond(bondIter)) {
        bond->setSnapshotManager(sman_);
      }
      for (bend = mol->beginBend(bendIter); bend != NULL;
           bend = mol->nextBend(bendIter)) {
        bend->setSnapshotManager(sman_);
      }
      for (torsion = mol->beginTorsion(torsionIter); torsion != NULL;
           torsion = mol->nextTorsion(torsionIter)) {
        torsion->setSnapshotManager(sman_);
      }
      for (inversion = mol->beginInversion(inversionIter); inversion != NULL;
           inversion = mol->nextInversion(inversionIter)) {
        inversion->setSnapshotManager(sman_);
      }
    }
  }